

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall
slang::ast::Type::isValidForRand(Type *this,RandMode mode,LanguageVersion languageVersion)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  Type *in_RDI;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  bool local_1;
  
  bVar1 = isIntegral(in_RDI);
  if (((!bVar1) && (bVar1 = isNull((Type *)0x4e5bde), !bVar1)) ||
     (bVar1 = isTaggedUnion((Type *)CONCAT44(in_ESI,in_EDX)), bVar1)) {
    bVar1 = isFloating((Type *)0x4e5c06);
    if (bVar1) {
      local_1 = in_ESI == 1 && 0 < in_EDX;
    }
    else {
      bVar1 = isArray((Type *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
      if (bVar1) {
        getArrayElementType((Type *)CONCAT44(in_ESI,in_EDX));
        local_1 = isValidForRand((Type *)CONCAT44(in_ESI,in_EDX),(RandMode)((ulong)in_RDI >> 0x20),
                                 (LanguageVersion)in_RDI);
      }
      else {
        bVar1 = isClass((Type *)0x4e5c6d);
        if ((bVar1) || (bVar1 = isUnpackedStruct((Type *)0x4e5c7b), bVar1)) {
          local_1 = in_ESI == 1;
        }
        else {
          local_1 = false;
        }
      }
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Type::isValidForRand(RandMode mode, LanguageVersion languageVersion) const {
    if ((isIntegral() || isNull()) && !isTaggedUnion())
        return true;

    if (isFloating())
        return mode == RandMode::Rand && languageVersion >= LanguageVersion::v1800_2023;

    if (isArray())
        return getArrayElementType()->isValidForRand(mode, languageVersion);

    if (isClass() || isUnpackedStruct())
        return mode == RandMode::Rand;

    return false;
}